

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O1

void __thiscall
llvm::SmallPtrSetImplBase::MoveHelper
          (SmallPtrSetImplBase *this,uint SmallSize,SmallPtrSetImplBase *RHS)

{
  void **ppvVar1;
  
  if (RHS == this) {
    __assert_fail("&RHS != this && \"Self-move should be handled by the caller.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                  ,0xbf,
                  "void llvm::SmallPtrSetImplBase::MoveHelper(unsigned int, SmallPtrSetImplBase &&)"
                 );
  }
  ppvVar1 = RHS->SmallArray;
  if (RHS->CurArray == ppvVar1) {
    this->CurArray = this->SmallArray;
    if ((ulong)RHS->NumNonEmpty != 0) {
      memmove(this->SmallArray,RHS->CurArray,(ulong)RHS->NumNonEmpty << 3);
    }
  }
  else {
    this->CurArray = RHS->CurArray;
    RHS->CurArray = ppvVar1;
  }
  this->CurArraySize = RHS->CurArraySize;
  this->NumNonEmpty = RHS->NumNonEmpty;
  this->NumTombstones = RHS->NumTombstones;
  RHS->CurArraySize = SmallSize;
  if (RHS->CurArray == RHS->SmallArray) {
    RHS->NumNonEmpty = 0;
    RHS->NumTombstones = 0;
    return;
  }
  __assert_fail("RHS.CurArray == RHS.SmallArray",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                ,0xd1,
                "void llvm::SmallPtrSetImplBase::MoveHelper(unsigned int, SmallPtrSetImplBase &&)");
}

Assistant:

void SmallPtrSetImplBase::MoveHelper(unsigned SmallSize,
                                     SmallPtrSetImplBase &&RHS) {
  assert(&RHS != this && "Self-move should be handled by the caller.");

  if (RHS.isSmall()) {
    // Copy a small RHS rather than moving.
    CurArray = SmallArray;
    std::copy(RHS.CurArray, RHS.CurArray + RHS.NumNonEmpty, CurArray);
  } else {
    CurArray = RHS.CurArray;
    RHS.CurArray = RHS.SmallArray;
  }

  // Copy the rest of the trivial members.
  CurArraySize = RHS.CurArraySize;
  NumNonEmpty = RHS.NumNonEmpty;
  NumTombstones = RHS.NumTombstones;

  // Make the RHS small and empty.
  RHS.CurArraySize = SmallSize;
  assert(RHS.CurArray == RHS.SmallArray);
  RHS.NumNonEmpty = 0;
  RHS.NumTombstones = 0;
}